

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_k_means_test.cc
# Opt level: O2

bool __thiscall AV1Kmeans::AV1KmeansTest1::CheckResult(AV1KmeansTest1 *this,int n)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = 0;
  if (0 < n) {
    uVar1 = (ulong)(uint)n;
  }
  do {
    if (uVar1 == uVar2) {
LAB_0063923a:
      return (long)n <= (long)uVar2;
    }
    if (this->indices1_[uVar2] != this->indices2_[uVar2]) {
      printf("%d ",uVar2 & 0xffffffff);
      printf("%d != %d ",(ulong)this->indices1_[uVar2],(ulong)this->indices2_[uVar2]);
      goto LAB_0063923a;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool CheckResult(int n) {
    for (int idx = 0; idx < n; ++idx) {
      if (indices1_[idx] != indices2_[idx]) {
        printf("%d ", idx);
        printf("%d != %d ", indices1_[idx], indices2_[idx]);
        return false;
      }
    }
    return true;
  }